

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFeatureElement::IfcFeatureElement(IfcFeatureElement *this)

{
  *(undefined ***)&(this->super_IfcElement).field_0x148 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcFeatureElement";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__008302d0);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x8301c8;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0x8302b8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x8301f0;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x830218;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x830240;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x830268;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x830290;
  return;
}

Assistant:

IfcFeatureElement() : Object("IfcFeatureElement") {}